

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.h
# Opt level: O2

void __thiscall
cppcms::widgets::numeric<double>::render_value(numeric<double> *this,form_context *context)

{
  char cVar1;
  ostream *poVar2;
  string local_40 [32];
  
  cVar1 = cppcms::widgets::base_widget::set();
  poVar2 = (ostream *)cppcms::form_context::out();
  poVar2 = std::operator<<(poVar2,"value=\"");
  if (cVar1 != '\0') {
    poVar2 = std::ostream::_M_insert<double>(this->value_);
    std::operator<<(poVar2,"\" ");
    return;
  }
  cppcms::util::escape(local_40);
  poVar2 = std::operator<<(poVar2,local_40);
  std::operator<<(poVar2,"\" ");
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

virtual void render_value(form_context &context)
			{
				if(set())
					context.out()<<"value=\""<<value_<<"\" ";
				else
					context.out()<<"value=\""<<util::escape(loaded_string_)<<"\" ";
			}